

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_b3cdf::ParserImpl::ParseFunctionBody(ParserImpl *this)

{
  int iVar1;
  int iVar2;
  anon_union_8_2_010d16d7_for_TokenDetail_0 aVar3;
  int iVar4;
  undefined4 uVar5;
  Lexer *in_RAX;
  TokenDetail *pTVar6;
  GCObject *pGVar7;
  String *pSVar8;
  TokenDetail *pTVar9;
  Lexer *pLVar10;
  ParseException *pPVar11;
  pointer *__ptr;
  ParserImpl *in_RSI;
  iterator __position;
  bool bVar12;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> block;
  Lexer *local_38;
  
  pTVar9 = &in_RSI->look_ahead_;
  local_38 = in_RAX;
  if ((in_RSI->look_ahead_).token_ == 0x11e) {
    luna::Lexer::GetToken(in_RSI->lexer_,pTVar9);
  }
  iVar1 = (in_RSI->look_ahead_).line_;
  pTVar6 = NextToken(in_RSI);
  if (pTVar6->token_ != 0x28) {
    pPVar11 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (pPVar11,"unexpect token after \'function\', expect \'(\'",&in_RSI->current_);
    __cxa_throw(pPVar11,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  if ((in_RSI->look_ahead_).token_ == 0x11e) {
    luna::Lexer::GetToken(in_RSI->lexer_,pTVar9);
  }
  if ((in_RSI->look_ahead_).token_ == 0x29) {
    pSVar8 = (String *)0x0;
  }
  else {
    if ((in_RSI->look_ahead_).token_ == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar9);
    }
    iVar2 = (in_RSI->look_ahead_).token_;
    if (iVar2 == 0x11e) {
      luna::Lexer::GetToken(in_RSI->lexer_,pTVar9);
    }
    else if (iVar2 == 0x115) {
      pGVar7 = (GCObject *)operator_new(0x20);
      pGVar7->_vptr_GCObject = (_func_int **)&PTR__NameList_00189348;
      pGVar7->next_ = (GCObject *)0x0;
      *(undefined8 *)&pGVar7->field_0x10 = 0;
      pGVar7[1]._vptr_GCObject = (_func_int **)0x0;
      pTVar6 = NextToken(in_RSI);
      __position._M_current = *(TokenDetail **)&pGVar7->field_0x10;
      if (__position._M_current == (TokenDetail *)pGVar7[1]._vptr_GCObject) {
        std::vector<luna::TokenDetail,std::allocator<luna::TokenDetail>>::
        _M_realloc_insert<luna::TokenDetail_const&>
                  ((vector<luna::TokenDetail,std::allocator<luna::TokenDetail>> *)&pGVar7->next_,
                   __position,pTVar6);
        goto LAB_00151d9f;
      }
      do {
        aVar3 = pTVar6->field_0;
        pSVar8 = pTVar6->module_;
        iVar2 = pTVar6->column_;
        iVar4 = pTVar6->token_;
        uVar5 = *(undefined4 *)&pTVar6->field_0x1c;
        (__position._M_current)->line_ = pTVar6->line_;
        (__position._M_current)->column_ = iVar2;
        (__position._M_current)->token_ = iVar4;
        *(undefined4 *)&(__position._M_current)->field_0x1c = uVar5;
        (__position._M_current)->field_0 = aVar3;
        (__position._M_current)->module_ = pSVar8;
        *(long *)&pGVar7->field_0x10 = *(long *)&pGVar7->field_0x10 + 0x20;
LAB_00151d9f:
        while( true ) {
          if ((in_RSI->look_ahead_).token_ == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,pTVar9);
          }
          bVar12 = (in_RSI->look_ahead_).token_ == 0x2c;
          if (!bVar12) goto LAB_00151e32;
          NextToken(in_RSI);
          if ((in_RSI->look_ahead_).token_ == 0x11e) {
            luna::Lexer::GetToken(in_RSI->lexer_,pTVar9);
          }
          iVar2 = (in_RSI->look_ahead_).token_;
          if (iVar2 != 0x115) {
            if (iVar2 == 0x11e) {
              luna::Lexer::GetToken(in_RSI->lexer_,pTVar9);
            }
            if ((in_RSI->look_ahead_).token_ != 0x11d) {
              pPVar11 = (ParseException *)__cxa_allocate_exception(0x20);
              luna::ParseException::ParseException(pPVar11,"unexpect token in param list",pTVar9);
              __cxa_throw(pPVar11,&luna::ParseException::typeinfo,luna::Exception::~Exception);
            }
            bVar12 = true;
            NextToken(in_RSI);
            goto LAB_00151e32;
          }
          pTVar6 = NextToken(in_RSI);
          __position._M_current = *(TokenDetail **)&pGVar7->field_0x10;
          if (__position._M_current != (TokenDetail *)pGVar7[1]._vptr_GCObject) break;
          std::vector<luna::TokenDetail,std::allocator<luna::TokenDetail>>::
          _M_realloc_insert<luna::TokenDetail_const&>
                    ((vector<luna::TokenDetail,std::allocator<luna::TokenDetail>> *)&pGVar7->next_,
                     __position,pTVar6);
        }
      } while( true );
    }
    if ((in_RSI->look_ahead_).token_ != 0x11d) {
      pPVar11 = (ParseException *)__cxa_allocate_exception(0x20);
      luna::ParseException::ParseException(pPVar11,"unexpect token in param list",pTVar9);
      __cxa_throw(pPVar11,&luna::ParseException::typeinfo,luna::Exception::~Exception);
    }
    bVar12 = true;
    pGVar7 = (GCObject *)0x0;
    NextToken(in_RSI);
LAB_00151e32:
    pSVar8 = (String *)operator_new(0x20);
    (pSVar8->super_GCObject)._vptr_GCObject = (_func_int **)&PTR__ParamList_00189308;
    (pSVar8->super_GCObject).next_ = pGVar7;
    (pSVar8->super_GCObject).field_0x10 = bVar12;
    (pSVar8->field_1).str_ = (char *)0x0;
  }
  pTVar9 = NextToken(in_RSI);
  if (pTVar9->token_ != 0x29) {
    pPVar11 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (pPVar11,"unexpect token after param list, expect \')\'",&in_RSI->current_);
    __cxa_throw(pPVar11,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  ParseBlock((ParserImpl *)&stack0xffffffffffffffc8);
  pTVar9 = NextToken(in_RSI);
  if (pTVar9->token_ != 0x105) {
    pPVar11 = (ParseException *)__cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              (pPVar11,"unexpect token after function body, expect \'end\'",&in_RSI->current_);
    __cxa_throw(pPVar11,&luna::ParseException::typeinfo,luna::Exception::~Exception);
  }
  pLVar10 = (Lexer *)operator_new(0x20);
  pLVar10->state_ = (State *)&PTR__FunctionBody_001892c8;
  pLVar10->module_ = pSVar8;
  *(Lexer **)&(pLVar10->in_stream_).super__Function_base._M_functor = local_38;
  (pLVar10->in_stream_).super__Function_base._M_functor._M_pod_data[8] = '\0';
  *(int *)((long)&(pLVar10->in_stream_).super__Function_base._M_functor + 0xc) = iVar1;
  this->lexer_ = pLVar10;
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)this;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseFunctionBody()
        {
            int line = LookAhead().line_;
            if (NextToken().token_ != '(')
                throw ParseException("unexpect token after 'function', expect '('", current_);

            std::unique_ptr<SyntaxTree> param_list;

            if (LookAhead().token_ != ')')
                param_list = ParseParamList();

            if (NextToken().token_ != ')')
                throw ParseException("unexpect token after param list, expect ')'", current_);

            std::unique_ptr<SyntaxTree> block = ParseBlock();

            if (NextToken().token_ != Token_End)
                throw ParseException("unexpect token after function body, expect 'end'", current_);

            return std::unique_ptr<SyntaxTree>(new FunctionBody(std::move(param_list),
                                                                std::move(block), line));
        }